

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O3

void cf2_hintmap_build(CF2_HintMap hintmap,CF2_ArrStack hStemHintArray,CF2_ArrStack vStemHintArray,
                      CF2_HintMask hintMask,CF2_F16Dot16 hintOrigin,FT_Bool initialMap)

{
  ulong uVar1;
  int iVar2;
  CF2_Font font;
  CF2_ArrStack pCVar3;
  size_t sVar4;
  void *pvVar5;
  int iVar6;
  FT_Long FVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  size_t *psVar13;
  uint uVar14;
  uint uVar15;
  int *piVar16;
  uint uVar17;
  uint uVar18;
  undefined7 in_register_00000089;
  uint uVar19;
  size_t sVar20;
  FT_Bool *pFVar21;
  ulong uVar22;
  uint uVar23;
  CF2_HintRec *pCVar24;
  bool bVar25;
  undefined1 local_e8 [8];
  CF2_HintMaskRec tempHintMask;
  undefined1 auStack_a8 [8];
  CF2_HintRec topHintEdge;
  CF2_HintRec dummy;
  
  font = hintmap->font;
  if (((int)CONCAT71(in_register_00000089,initialMap) == 0) &&
     (hintmap->initialHintMap->isValid == '\0')) {
    local_e8 = (undefined1  [8])hintMask->error;
    tempHintMask.bitCount = 0;
    tempHintMask.byteCount = 0;
    tempHintMask.error = (FT_Error *)0x0;
    tempHintMask.isValid = '\0';
    tempHintMask.isNew = '\0';
    tempHintMask._10_6_ = 0;
    tempHintMask.mask[0] = '\0';
    tempHintMask.mask[1] = '\0';
    tempHintMask.mask[2] = '\0';
    tempHintMask.mask[3] = '\0';
    tempHintMask.mask[4] = '\0';
    tempHintMask.mask[5] = '\0';
    tempHintMask.mask[6] = '\0';
    tempHintMask.mask[7] = '\0';
    cf2_hintmap_build(hintmap->initialHintMap,hStemHintArray,vStemHintArray,(CF2_HintMask)local_e8,
                      hintOrigin,'\x01');
  }
  if (hintMask->isValid == '\0') {
    uVar11 = vStemHintArray->count + hStemHintArray->count;
    if (0x60 < uVar11) {
      piVar16 = hintMask->error;
      if ((piVar16 != (int *)0x0) && (*piVar16 == 0)) {
        *piVar16 = 0x12;
      }
LAB_00210171:
      if (font->isT1 == '\0') {
        return;
      }
      *hintMask->error = 0;
      pFVar21 = &hintmap->hinted;
      goto LAB_002104c7;
    }
    hintMask->bitCount = uVar11;
    hintMask->byteCount = uVar11 + 7 >> 3;
    hintMask->isValid = '\x01';
    hintMask->isNew = '\x01';
    if (uVar11 != 0) {
      uVar22 = 0;
      do {
        hintMask->mask[uVar22] = 0xff;
        uVar22 = uVar22 + 1;
      } while (uVar22 < hintMask->byteCount);
      hintMask->mask[hintMask->byteCount - 1] =
           hintMask->mask[hintMask->byteCount - 1] & -1 << (-(char)uVar11 & 7U);
      if (hintMask->isValid == '\0') goto LAB_00210171;
    }
  }
  hintmap->count = 0;
  hintmap->lastIndex = 0;
  local_e8 = (undefined1  [8])hintMask->error;
  tempHintMask.error = *(FT_Error **)&hintMask->isValid;
  tempHintMask._8_8_ = hintMask->bitCount;
  tempHintMask.bitCount = hintMask->byteCount;
  tempHintMask.byteCount = *(size_t *)hintMask->mask;
  tempHintMask.mask._0_8_ = *(undefined8 *)(hintMask->mask + 8);
  uVar11 = hStemHintArray->count;
  if (hintMask->bitCount < uVar11) {
    return;
  }
  if ((font->blues).doEmBoxHints != '\0') {
    dummy.index = 0;
    topHintEdge.scale = 0;
    topHintEdge._28_4_ = 0;
    cf2_hintmap_insertHint(hintmap,&(font->blues).emBoxBottomEdge,(CF2_Hint)&topHintEdge.scale);
    cf2_hintmap_insertHint(hintmap,(CF2_Hint)&topHintEdge.scale,&(font->blues).emBoxTopEdge);
  }
  if (uVar11 == 0) {
    if (initialMap != '\0') goto LAB_00210197;
  }
  else {
    psVar13 = &tempHintMask.byteCount;
    sVar20 = 0;
    uVar23 = 0x80;
    do {
      if ((uVar23 & (byte)*psVar13) != 0) {
        cf2_hint_init((CF2_Hint)&topHintEdge.scale,hStemHintArray,sVar20,font,hintOrigin,
                      hintmap->scale,'\x01');
        cf2_hint_init((CF2_Hint)auStack_a8,hStemHintArray,sVar20,font,hintOrigin,hintmap->scale,'\0'
                     );
        if (((topHintEdge._24_8_ & 0x10) == 0) && (((ulong)auStack_a8 & 0x10) == 0)) {
          uVar22 = (ulong)(font->blues).count;
          if (uVar22 != 0) {
            iVar6 = (font->blues).blueFuzz;
            lVar8 = 0;
            do {
              iVar10 = dummy.index._4_4_;
              if ((&(font->blues).zone[0].bottomZone)[lVar8] == '\0') {
                if (((((ulong)auStack_a8 & 10) != 0) &&
                    (iVar10 = *(int *)((long)&(font->blues).zone[0].csBottomEdge + lVar8),
                    iVar10 - iVar6 <= (int)topHintEdge.index)) &&
                   ((int)topHintEdge.index <=
                    *(int *)((long)&(font->blues).zone[0].csTopEdge + lVar8) + iVar6)) {
                  if ((font->blues).suppressOvershoot == '\0') {
                    uVar9 = topHintEdge.index._4_4_ + 0x8000U & 0xffff0000;
                    if (((font->blues).blueShift <= (int)topHintEdge.index - iVar10) &&
                       (uVar14 = *(int *)((long)&(font->blues).zone[0].dsFlatEdge + lVar8) + 0x10000
                       , (int)uVar9 <= (int)uVar14)) {
                      uVar9 = uVar14;
                    }
                  }
                  else {
                    uVar9 = *(uint *)((long)&(font->blues).zone[0].dsFlatEdge + lVar8);
                  }
                  iVar10 = uVar9 - topHintEdge.index._4_4_;
                  if (topHintEdge.scale != 0) {
                    dummy.index = CONCAT44(dummy.index._4_4_ + iVar10,(int)dummy.index);
                    topHintEdge._24_8_ = topHintEdge._24_8_ | 0x10;
                  }
                  goto LAB_0020ffd5;
                }
              }
              else if ((((topHintEdge._24_8_ & 5) != 0) &&
                       (*(int *)((long)&(font->blues).zone[0].csBottomEdge + lVar8) - iVar6 <=
                        (int)dummy.index)) &&
                      (iVar2 = *(int *)((long)&(font->blues).zone[0].csTopEdge + lVar8),
                      (int)dummy.index <= iVar2 + iVar6)) {
                if ((font->blues).suppressOvershoot == '\0') {
                  uVar9 = dummy.index._4_4_ + 0x8000U & 0xffff0000;
                  if (((font->blues).blueShift <= iVar2 - (int)dummy.index) &&
                     (uVar14 = *(int *)((long)&(font->blues).zone[0].dsFlatEdge + lVar8) - 0x10000,
                     (int)uVar14 <= (int)uVar9)) {
                    uVar9 = uVar14;
                  }
                }
                else {
                  uVar9 = *(uint *)((long)&(font->blues).zone[0].dsFlatEdge + lVar8);
                }
                dummy.index = CONCAT44(uVar9,(int)dummy.index);
                topHintEdge._24_8_ = topHintEdge._24_8_ | 0x10;
                if (auStack_a8._0_4_ != 0) {
                  iVar10 = uVar9 - iVar10;
LAB_0020ffd5:
                  topHintEdge.index =
                       CONCAT44(topHintEdge.index._4_4_ + iVar10,(int)topHintEdge.index);
                  auStack_a8 = (undefined1  [8])((ulong)auStack_a8 | 0x10);
                }
                goto LAB_0020ffe8;
              }
              lVar8 = lVar8 + 0x14;
            } while (uVar22 * 0x14 != lVar8);
          }
        }
        else {
LAB_0020ffe8:
          cf2_hintmap_insertHint(hintmap,(CF2_Hint)&topHintEdge.scale,(CF2_Hint)auStack_a8);
          *(byte *)psVar13 = (byte)*psVar13 & ~(byte)uVar23;
        }
      }
      uVar23 = uVar23 >> 1;
      bVar25 = (~(uint)sVar20 & 7) == 0;
      if (bVar25) {
        uVar23 = 0x80;
      }
      psVar13 = (size_t *)((long)psVar13 + (ulong)bVar25);
      sVar20 = sVar20 + 1;
    } while (sVar20 != uVar11);
    if (initialMap == '\0') {
      sVar20 = 0;
      uVar23 = 0x80;
      psVar13 = &tempHintMask.byteCount;
      do {
        if ((uVar23 & (byte)*psVar13) != 0) {
          cf2_hint_init((CF2_Hint)&topHintEdge.scale,hStemHintArray,sVar20,font,hintOrigin,
                        hintmap->scale,'\x01');
          cf2_hint_init((CF2_Hint)auStack_a8,hStemHintArray,sVar20,font,hintOrigin,hintmap->scale,
                        '\0');
          cf2_hintmap_insertHint(hintmap,(CF2_Hint)&topHintEdge.scale,(CF2_Hint)auStack_a8);
        }
        uVar23 = uVar23 >> 1;
        bVar25 = (~(uint)sVar20 & 7) == 0;
        if (bVar25) {
          uVar23 = 0x80;
        }
        psVar13 = (size_t *)((long)psVar13 + (ulong)bVar25);
        sVar20 = sVar20 + 1;
      } while (uVar11 != sVar20);
    }
    else {
LAB_00210197:
      if (((hintmap->count == 0) || (0 < hintmap->edge[0].csCoord)) ||
         (hintmap->edge[hintmap->count - 1].csCoord < 0)) {
        topHintEdge.scale = 0x31;
        topHintEdge._28_4_ = 0;
        auStack_a8 = (undefined1  [8])0x0;
        topHintEdge.flags = 0;
        topHintEdge._4_4_ = 0;
        topHintEdge.index = 0;
        topHintEdge.csCoord = 0;
        topHintEdge.dsCoord = 0;
        cf2_hintmap_insertHint(hintmap,(CF2_Hint)&topHintEdge.scale,(CF2_Hint)auStack_a8);
      }
    }
  }
  hintmap->hintMoves->count = 0;
  uVar11 = (ulong)hintmap->count;
  if (hintmap->count != 0) {
    pCVar24 = hintmap->edge;
    uVar22 = 0;
    do {
      uVar23 = pCVar24[uVar22].flags;
      uVar1 = uVar22 + 1;
      uVar12 = uVar22;
      if ((uVar23 & 0xc) != 0) {
        uVar12 = uVar1;
      }
      if ((uVar23 & 0x10) == 0) {
        uVar9 = pCVar24[uVar22].dsCoord;
        uVar18 = uVar9 & 0xffff;
        uVar14 = hintmap->edge[uVar12].dsCoord;
        uVar17 = uVar14 & 0xffff;
        uVar19 = 0x10000 - uVar18;
        if (uVar18 == 0) {
          uVar19 = 0;
        }
        uVar15 = 0x10000 - uVar17;
        if (uVar17 == 0) {
          uVar15 = 0;
        }
        if (uVar19 < uVar15) {
          uVar15 = uVar19;
        }
        if (uVar18 < uVar17) {
          uVar17 = uVar18;
        }
        uVar19 = -uVar17;
        if ((uVar12 < (int)uVar11 - 1) &&
           (hintmap->edge[uVar12 + 1].dsCoord < (int)(uVar14 + uVar15 + 0x8000))) {
          if ((((uVar22 != 0) &&
               (uVar14 = 0, (int)((uVar9 - uVar17) + -0x8000) < pCVar24[uVar22 - 1].dsCoord)) ||
              (uVar14 = uVar19, uVar15 < uVar17)) && ((pCVar24[uVar12 + 1].flags & 0x10) == 0)) {
            topHintEdge._24_8_ = uVar12;
            cf2_arrstack_push(hintmap->hintMoves,&topHintEdge.scale);
            uVar9 = pCVar24[uVar22].dsCoord;
          }
        }
        else if (((uVar22 == 0) ||
                 (uVar14 = uVar15, pCVar24[uVar22 - 1].dsCoord <= (int)((uVar9 - uVar17) + -0x8000))
                 ) && (uVar14 = uVar19, uVar15 <= uVar17)) {
          uVar14 = uVar15;
        }
        pCVar24[uVar22].dsCoord = uVar9 + uVar14;
        if ((uVar23 & 0xc) != 0) {
          pCVar24[uVar12].dsCoord = pCVar24[uVar12].dsCoord + uVar14;
        }
      }
      if ((uVar22 != 0) &&
         (iVar6 = pCVar24[uVar22].csCoord - pCVar24[uVar22 - 1].csCoord, iVar6 != 0)) {
        FVar7 = FT_DivFix((long)(pCVar24[uVar22].dsCoord - pCVar24[uVar22 - 1].dsCoord),(long)iVar6)
        ;
        pCVar24[uVar22 - 1].scale = (CF2_F16Dot16)FVar7;
      }
      uVar11 = uVar22;
      if (((uVar23 & 0xc) != 0) &&
         (iVar6 = hintmap->edge[uVar22 + 1].csCoord - pCVar24[uVar22].csCoord, uVar11 = uVar1,
         iVar6 != 0)) {
        FVar7 = FT_DivFix((long)(pCVar24[uVar22 + 1].dsCoord - pCVar24[uVar22].dsCoord),(long)iVar6)
        ;
        pCVar24[uVar22].scale = (CF2_F16Dot16)FVar7;
      }
      uVar22 = uVar11 + 1;
      uVar23 = hintmap->count;
      uVar11 = (ulong)uVar23;
    } while (uVar22 < uVar11);
    pCVar3 = hintmap->hintMoves;
    sVar20 = pCVar3->count;
    if (sVar20 != 0) {
      sVar4 = pCVar3->sizeItem;
      piVar16 = (int *)((long)pCVar3->ptr + (sVar20 - 1) * sVar4 + 8);
      do {
        lVar8 = *(long *)(piVar16 + -2);
        iVar6 = hintmap->edge[lVar8].dsCoord;
        iVar10 = *piVar16;
        if ((iVar10 + iVar6 + 0x8000 <= hintmap->edge[lVar8 + 1].dsCoord) &&
           (pCVar24[lVar8].dsCoord = iVar6 + iVar10, (pCVar24[lVar8].flags & 0xc) != 0)) {
          pCVar24[lVar8 + -1].dsCoord = pCVar24[lVar8 + -1].dsCoord + iVar10;
        }
        sVar20 = sVar20 - 1;
        piVar16 = (int *)((long)piVar16 - sVar4);
      } while (sVar20 != 0);
    }
    if (uVar23 != 0 && initialMap == '\0') {
      uVar22 = 0;
      do {
        uVar23 = pCVar24->flags;
        if ((uVar23 & 0x20) == 0) {
          uVar11 = pCVar24->index;
          if (hStemHintArray->count <= uVar11) {
            piVar16 = hStemHintArray->error;
            if ((piVar16 != (int *)0x0) && (*piVar16 == 0)) {
              *piVar16 = 0x82;
              uVar23 = pCVar24->flags;
            }
            uVar11 = 0;
          }
          pvVar5 = hStemHintArray->ptr;
          lVar8 = uVar11 * hStemHintArray->sizeItem;
          *(CF2_F16Dot16 *)((long)pvVar5 + (ulong)((uVar23 & 10) != 0) * 4 + lVar8 + 0xc) =
               pCVar24->dsCoord;
          *(undefined1 *)((long)pvVar5 + lVar8) = 1;
          uVar11 = (ulong)hintmap->count;
        }
        uVar22 = uVar22 + 1;
        pCVar24 = pCVar24 + 1;
      } while (uVar22 < uVar11);
    }
  }
  hintmap->isValid = '\x01';
  pFVar21 = &hintMask->isNew;
LAB_002104c7:
  *pFVar21 = '\0';
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cf2_hintmap_build( CF2_HintMap   hintmap,
                     CF2_ArrStack  hStemHintArray,
                     CF2_ArrStack  vStemHintArray,
                     CF2_HintMask  hintMask,
                     CF2_Fixed     hintOrigin,
                     FT_Bool       initialMap )
  {
    FT_Byte*  maskPtr;

    CF2_Font         font = hintmap->font;
    CF2_HintMaskRec  tempHintMask;

    size_t   bitCount, i;
    FT_Byte  maskByte;


    /* check whether initial map is constructed */
    if ( !initialMap && !cf2_hintmap_isValid( hintmap->initialHintMap ) )
    {
      /* make recursive call with initialHintMap and temporary mask; */
      /* temporary mask will get all bits set, below */
      cf2_hintmask_init( &tempHintMask, hintMask->error );
      cf2_hintmap_build( hintmap->initialHintMap,
                         hStemHintArray,
                         vStemHintArray,
                         &tempHintMask,
                         hintOrigin,
                         TRUE );
    }

    if ( !cf2_hintmask_isValid( hintMask ) )
    {
      /* without a hint mask, assume all hints are active */
      cf2_hintmask_setAll( hintMask,
                           cf2_arrstack_size( hStemHintArray ) +
                             cf2_arrstack_size( vStemHintArray ) );
      if ( !cf2_hintmask_isValid( hintMask ) )
      {
        if ( font->isT1 )
        {
          /* no error, just continue unhinted */
          *hintMask->error = FT_Err_Ok;
          hintmap->hinted  = FALSE;
        }
        return;                   /* too many stem hints */
      }
    }

    /* begin by clearing the map */
    hintmap->count     = 0;
    hintmap->lastIndex = 0;

    /* make a copy of the hint mask so we can modify it */
    tempHintMask = *hintMask;
    maskPtr      = cf2_hintmask_getMaskPtr( &tempHintMask );

    /* use the hStem hints only, which are first in the mask */
    bitCount = cf2_arrstack_size( hStemHintArray );

    /* Defense-in-depth.  Should never return here. */
    if ( bitCount > hintMask->bitCount )
      return;

    /* synthetic embox hints get highest priority */
    if ( font->blues.doEmBoxHints )
    {
      CF2_HintRec  dummy;


      cf2_hint_initZero( &dummy );   /* invalid hint map element */

      /* ghost bottom */
      cf2_hintmap_insertHint( hintmap,
                              &font->blues.emBoxBottomEdge,
                              &dummy );
      /* ghost top */
      cf2_hintmap_insertHint( hintmap,
                              &dummy,
                              &font->blues.emBoxTopEdge );
    }

    /* insert hints captured by a blue zone or already locked (higher */
    /* priority)                                                      */
    for ( i = 0, maskByte = 0x80; i < bitCount; i++ )
    {
      if ( maskByte & *maskPtr )
      {
        /* expand StemHint into two `CF2_Hint' elements */
        CF2_HintRec  bottomHintEdge, topHintEdge;


        cf2_hint_init( &bottomHintEdge,
                       hStemHintArray,
                       i,
                       font,
                       hintOrigin,
                       hintmap->scale,
                       TRUE /* bottom */ );
        cf2_hint_init( &topHintEdge,
                       hStemHintArray,
                       i,
                       font,
                       hintOrigin,
                       hintmap->scale,
                       FALSE /* top */ );

        if ( cf2_hint_isLocked( &bottomHintEdge ) ||
             cf2_hint_isLocked( &topHintEdge )    ||
             cf2_blues_capture( &font->blues,
                                &bottomHintEdge,
                                &topHintEdge )   )
        {
          /* insert captured hint into map */
          cf2_hintmap_insertHint( hintmap, &bottomHintEdge, &topHintEdge );

          *maskPtr &= ~maskByte;      /* turn off the bit for this hint */
        }
      }

      if ( ( i & 7 ) == 7 )
      {
        /* move to next mask byte */
        maskPtr++;
        maskByte = 0x80;
      }
      else
        maskByte >>= 1;
    }

    /* initial hint map includes only captured hints plus maybe one at 0 */

    /*
     * TODO: There is a problem here because we are trying to build a
     *       single hint map containing all captured hints.  It is
     *       possible for there to be conflicts between captured hints,
     *       either because of darkening or because the hints are in
     *       separate hint zones (we are ignoring hint zones for the
     *       initial map).  An example of the latter is MinionPro-Regular
     *       v2.030 glyph 883 (Greek Capital Alpha with Psili) at 15ppem.
     *       A stem hint for the psili conflicts with the top edge hint
     *       for the base character.  The stem hint gets priority because
     *       of its sort order.  In glyph 884 (Greek Capital Alpha with
     *       Psili and Oxia), the top of the base character gets a stem
     *       hint, and the psili does not.  This creates different initial
     *       maps for the two glyphs resulting in different renderings of
     *       the base character.  Will probably defer this either as not
     *       worth the cost or as a font bug.  I don't think there is any
     *       good reason for an accent to be captured by an alignment
     *       zone.  -darnold 2/12/10
     */

    if ( initialMap )
    {
      /* Apply a heuristic that inserts a point for (0,0), unless it's     */
      /* already covered by a mapping.  This locks the baseline for glyphs */
      /* that have no baseline hints.                                      */

      if ( hintmap->count == 0                           ||
           hintmap->edge[0].csCoord > 0                  ||
           hintmap->edge[hintmap->count - 1].csCoord < 0 )
      {
        /* all edges are above 0 or all edges are below 0; */
        /* construct a locked edge hint at 0               */

        CF2_HintRec  edge, invalid;


        cf2_hint_initZero( &edge );

        edge.flags = CF2_GhostBottom |
                     CF2_Locked      |
                     CF2_Synthetic;
        edge.scale = hintmap->scale;

        cf2_hint_initZero( &invalid );
        cf2_hintmap_insertHint( hintmap, &edge, &invalid );
      }
    }
    else
    {
      /* insert remaining hints */

      maskPtr = cf2_hintmask_getMaskPtr( &tempHintMask );

      for ( i = 0, maskByte = 0x80; i < bitCount; i++ )
      {
        if ( maskByte & *maskPtr )
        {
          CF2_HintRec  bottomHintEdge, topHintEdge;


          cf2_hint_init( &bottomHintEdge,
                         hStemHintArray,
                         i,
                         font,
                         hintOrigin,
                         hintmap->scale,
                         TRUE /* bottom */ );
          cf2_hint_init( &topHintEdge,
                         hStemHintArray,
                         i,
                         font,
                         hintOrigin,
                         hintmap->scale,
                         FALSE /* top */ );

          cf2_hintmap_insertHint( hintmap, &bottomHintEdge, &topHintEdge );
        }

        if ( ( i & 7 ) == 7 )
        {
          /* move to next mask byte */
          maskPtr++;
          maskByte = 0x80;
        }
        else
          maskByte >>= 1;
      }
    }

    FT_TRACE6(( initialMap ? "flags: [p]air [g]host [t]op "
                             "[b]ottom [L]ocked [S]ynthetic\n"
                             "Initial hintmap\n"
                           : "Hints:\n" ));
    cf2_hintmap_dump( hintmap );

    /*
     * Note: The following line is a convenient place to break when
     *       debugging hinting.  Examine `hintmap->edge' for the list of
     *       enabled hints, then step over the call to see the effect of
     *       adjustment.  We stop here first on the recursive call that
     *       creates the initial map, and then on each counter group and
     *       hint zone.
     */

    /* adjust positions of hint edges that are not locked to blue zones */
    cf2_hintmap_adjustHints( hintmap );

    FT_TRACE6(( "(adjusted)\n" ));
    cf2_hintmap_dump( hintmap );

    /* save the position of all hints that were used in this hint map; */
    /* if we use them again, we'll locate them in the same position    */
    if ( !initialMap )
    {
      for ( i = 0; i < hintmap->count; i++ )
      {
        if ( !cf2_hint_isSynthetic( &hintmap->edge[i] ) )
        {
          /* Note: include both valid and invalid edges            */
          /* Note: top and bottom edges are copied back separately */
          CF2_StemHint  stemhint = (CF2_StemHint)
                          cf2_arrstack_getPointer( hStemHintArray,
                                                   hintmap->edge[i].index );


          if ( cf2_hint_isTop( &hintmap->edge[i] ) )
            stemhint->maxDS = hintmap->edge[i].dsCoord;
          else
            stemhint->minDS = hintmap->edge[i].dsCoord;

          stemhint->used = TRUE;
        }
      }
    }

    /* hint map is ready to use */
    hintmap->isValid = TRUE;

    /* remember this mask has been used */
    cf2_hintmask_setNew( hintMask, FALSE );
  }